

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

void amrex::VisMF::ReadFAHeader(string *fafabName,Vector<char,_std::allocator<char>_> *faHeader)

{
  pointer pcVar1;
  string FullHdrFileName;
  string local_40;
  MPI_Comm local_1c;
  
  pcVar1 = (fafabName->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + fafabName->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  local_1c = ParallelDescriptor::m_comm;
  ParallelDescriptor::ReadAndBcastFile(&local_40,faHeader,true,&local_1c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
VisMF::ReadFAHeader (const std::string &fafabName,
                     Vector<char> &faHeader)
{
//    BL_PROFILE("VisMF::ReadFAHeader()");

    std::string FullHdrFileName(fafabName + TheMultiFabHdrFileSuffix);
    ParallelDescriptor::ReadAndBcastFile(FullHdrFileName, faHeader);
}